

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::mark_scalar_layout_structs(CompilerMSL *this,SPIRType *type)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  size_t sVar4;
  TypedID *this_00;
  SPIRType *pSVar5;
  uint *puVar6;
  CompilerError *pCVar7;
  allocator local_b9;
  string local_b8 [35];
  undefined1 local_95;
  allocator local_81;
  string local_80 [36];
  uint local_5c;
  uint32_t local_58;
  uint local_54;
  uint32_t array_size;
  uint32_t dim;
  uint32_t dimensions;
  byte local_42;
  bool struct_needs_explicit_padding;
  uint32_t array_stride;
  bool struct_is_too_large;
  uint32_t uStack_3c;
  bool struct_is_misaligned;
  uint32_t spirv_offset_next;
  uint32_t spirv_offset;
  uint32_t msl_size;
  uint32_t msl_alignment;
  SPIRType *struct_type;
  SPIRType *mbr_type;
  uint32_t i;
  uint32_t mbr_cnt;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  _i = type;
  type_local = (SPIRType *)this;
  sVar4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                    (&(type->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
  mbr_type._4_4_ = (uint)sVar4;
  mbr_type._0_4_ = 0;
  do {
    if (mbr_type._4_4_ <= (uint)mbr_type) {
      return;
    }
    this_00 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                        (&(_i->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                         (ulong)(uint)mbr_type);
    uVar2 = TypedID::operator_cast_to_unsigned_int(this_00);
    struct_type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
    if ((*(int *)&(struct_type->super_IVariant).field_0xc == 0xf) &&
       ((pSVar5 = struct_type, (struct_type->pointer & 1U) == 0 ||
        (struct_type->storage != StorageClassPhysicalStorageBuffer)))) {
      while (_msl_size = pSVar5,
            bVar1 = VectorView<unsigned_int>::empty
                              (&(_msl_size->array).super_VectorView<unsigned_int>),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_msl_size->parent_type);
        pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
      }
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(_msl_size->super_IVariant).self);
      bVar1 = Compiler::has_extended_decoration
                        ((Compiler *)this,uVar2,SPIRVCrossDecorationPhysicalTypePacked);
      if (!bVar1) {
        spirv_offset = get_declared_struct_member_alignment_msl(this,_i,(uint)mbr_type);
        spirv_offset_next = get_declared_struct_member_size_msl(this,_i,(uint)mbr_type);
        uStack_3c = Compiler::type_struct_member_offset((Compiler *)this,_i,(uint)mbr_type);
        if ((uint)mbr_type + 1 < mbr_type._4_4_) {
          array_stride = Compiler::type_struct_member_offset((Compiler *)this,_i,(uint)mbr_type + 1)
          ;
        }
        else {
          array_stride = uStack_3c + spirv_offset_next;
        }
        struct_needs_explicit_padding = uStack_3c % spirv_offset != 0;
        local_42 = array_stride < uStack_3c + spirv_offset_next;
        dimensions = 0;
        dim._3_1_ = 0;
        bVar1 = VectorView<unsigned_int>::empty
                          (&(struct_type->array).super_VectorView<unsigned_int>);
        if (!bVar1) {
          dimensions = Compiler::type_struct_member_array_stride((Compiler *)this,_i,(uint)mbr_type)
          ;
          sVar4 = VectorView<unsigned_int>::size
                            (&(struct_type->array).super_VectorView<unsigned_int>);
          array_size = (int)sVar4 - 1;
          for (local_54 = 0; local_54 < array_size; local_54 = local_54 + 1) {
            local_58 = CompilerGLSL::to_array_size_literal
                                 (&this->super_CompilerGLSL,struct_type,local_54);
            local_5c = 1;
            puVar6 = ::std::max<unsigned_int>(&local_58,&local_5c);
            dimensions = dimensions / *puVar6;
          }
          dim._3_1_ = 1;
          uVar2 = get_declared_struct_size_msl(this,_msl_size,false,false);
          if (dimensions < uVar2) {
            local_42 = 1;
          }
        }
        if (((struct_needs_explicit_padding & 1U) != 0) || ((local_42 & 1) != 0)) {
          mark_struct_members_packed(this,_msl_size);
        }
        mark_scalar_layout_structs(this,_msl_size);
        if ((dim._3_1_ & 1) != 0) {
          spirv_offset_next = get_declared_struct_size_msl(this,_msl_size,true,true);
          if (dimensions < spirv_offset_next) {
            local_95 = 1;
            pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_80,"Cannot express an array stride smaller than size of struct type.",
                       &local_81);
            CompilerError::CompilerError(pCVar7,(string *)local_80);
            local_95 = 0;
            __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar2 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(_msl_size->super_IVariant).self);
          bVar1 = Compiler::has_extended_decoration
                            ((Compiler *)this,uVar2,SPIRVCrossDecorationPaddingTarget);
          uVar2 = dimensions;
          if (bVar1) {
            uVar3 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(_msl_size->super_IVariant).self);
            uVar3 = Compiler::get_extended_decoration
                              ((Compiler *)this,uVar3,SPIRVCrossDecorationPaddingTarget);
            if (uVar2 != uVar3) {
              pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_b8,
                         "A struct is used with different array strides. Cannot express this in MSL."
                         ,&local_b9);
              CompilerError::CompilerError(pCVar7,(string *)local_b8);
              __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
          }
          else {
            uVar2 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(_msl_size->super_IVariant).self);
            Compiler::set_extended_decoration
                      ((Compiler *)this,uVar2,SPIRVCrossDecorationPaddingTarget,dimensions);
          }
        }
      }
    }
    mbr_type._0_4_ = (uint)mbr_type + 1;
  } while( true );
}

Assistant:

void CompilerMSL::mark_scalar_layout_structs(const SPIRType &type)
{
	uint32_t mbr_cnt = uint32_t(type.member_types.size());
	for (uint32_t i = 0; i < mbr_cnt; i++)
	{
		// Handle possible recursion when a struct contains a pointer to its own type nested somewhere.
		auto &mbr_type = get<SPIRType>(type.member_types[i]);
		if (mbr_type.basetype == SPIRType::Struct && !(mbr_type.pointer && mbr_type.storage == StorageClassPhysicalStorageBuffer))
		{
			auto *struct_type = &mbr_type;
			while (!struct_type->array.empty())
				struct_type = &get<SPIRType>(struct_type->parent_type);

			if (has_extended_decoration(struct_type->self, SPIRVCrossDecorationPhysicalTypePacked))
				continue;

			uint32_t msl_alignment = get_declared_struct_member_alignment_msl(type, i);
			uint32_t msl_size = get_declared_struct_member_size_msl(type, i);
			uint32_t spirv_offset = type_struct_member_offset(type, i);
			uint32_t spirv_offset_next;
			if (i + 1 < mbr_cnt)
				spirv_offset_next = type_struct_member_offset(type, i + 1);
			else
				spirv_offset_next = spirv_offset + msl_size;

			// Both are complicated cases. In scalar layout, a struct of float3 might just consume 12 bytes,
			// and the next member will be placed at offset 12.
			bool struct_is_misaligned = (spirv_offset % msl_alignment) != 0;
			bool struct_is_too_large = spirv_offset + msl_size > spirv_offset_next;
			uint32_t array_stride = 0;
			bool struct_needs_explicit_padding = false;

			// Verify that if a struct is used as an array that ArrayStride matches the effective size of the struct.
			if (!mbr_type.array.empty())
			{
				array_stride = type_struct_member_array_stride(type, i);
				uint32_t dimensions = uint32_t(mbr_type.array.size() - 1);
				for (uint32_t dim = 0; dim < dimensions; dim++)
				{
					uint32_t array_size = to_array_size_literal(mbr_type, dim);
					array_stride /= max(array_size, 1u);
				}

				// Set expected struct size based on ArrayStride.
				struct_needs_explicit_padding = true;

				// If struct size is larger than array stride, we might be able to fit, if we tightly pack.
				if (get_declared_struct_size_msl(*struct_type) > array_stride)
					struct_is_too_large = true;
			}

			if (struct_is_misaligned || struct_is_too_large)
				mark_struct_members_packed(*struct_type);
			mark_scalar_layout_structs(*struct_type);

			if (struct_needs_explicit_padding)
			{
				msl_size = get_declared_struct_size_msl(*struct_type, true, true);
				if (array_stride < msl_size)
				{
					SPIRV_CROSS_THROW("Cannot express an array stride smaller than size of struct type.");
				}
				else
				{
					if (has_extended_decoration(struct_type->self, SPIRVCrossDecorationPaddingTarget))
					{
						if (array_stride !=
						    get_extended_decoration(struct_type->self, SPIRVCrossDecorationPaddingTarget))
							SPIRV_CROSS_THROW(
							    "A struct is used with different array strides. Cannot express this in MSL.");
					}
					else
						set_extended_decoration(struct_type->self, SPIRVCrossDecorationPaddingTarget, array_stride);
				}
			}
		}
	}
}